

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

Maybe<int> __thiscall capnp::MembraneHook::getFd(MembraneHook *this)

{
  char cVar1;
  undefined8 in_RAX;
  long in_RSI;
  undefined8 local_28;
  
  local_28 = in_RAX;
  (**(code **)(**(long **)(in_RSI + 0x28) + 0x28))(&local_28);
  if ((char)local_28 != '\0') {
    cVar1 = (**(code **)(**(long **)(in_RSI + 0x38) + 0x28))();
    if (cVar1 != '\0') {
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
      *(undefined4 *)((long)&(this->super_ClientHook)._vptr_ClientHook + 4) = local_28._4_4_;
      return (Maybe<int>)(NullableValue<int>)this;
    }
  }
  *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 0;
  return (Maybe<int>)(NullableValue<int>)this;
}

Assistant:

kj::Maybe<int> getFd() override {
    KJ_IF_SOME(f, inner->getFd()) {
      if (policy->allowFdPassthrough()) {
        return f;
      }
    }
    return kj::none;
  }